

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *out_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,bool show_mesh,
               bool show_aabb)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  ImVec2 IVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ImVec2 triangle [3];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ImVec2 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (show_mesh || show_aabb) {
    if ((draw_list->IdxBuffer).Size < 1) {
      puVar9 = (unsigned_short *)0x0;
    }
    else {
      puVar9 = (draw_list->IdxBuffer).Data;
    }
    uVar2 = draw_cmd->VtxOffset;
    pIVar4 = (draw_list->VtxBuffer).Data;
    local_58._0_4_ = (draw_cmd->ClipRect).x;
    local_58._4_4_ = (draw_cmd->ClipRect).y;
    uStack_50 = 0;
    local_48._0_4_ = (draw_cmd->ClipRect).z;
    local_48._4_4_ = (draw_cmd->ClipRect).w;
    uStack_40 = 0;
    uVar3 = out_draw_list->Flags;
    out_draw_list->Flags = uVar3 & 0xfffffffe;
    uVar6 = draw_cmd->IdxOffset;
    uVar8 = (ulong)uVar6;
    if (uVar6 < draw_cmd->ElemCount + uVar6) {
      auVar15._8_4_ = 0xff7fffff;
      auVar15._0_8_ = 0xff7fffffff7fffff;
      auVar15._12_4_ = 0xff7fffff;
      auVar16._8_4_ = 0x7f7fffff;
      auVar16._0_8_ = 0x7f7fffff7f7fffff;
      auVar16._12_4_ = 0x7f7fffff;
      do {
        local_78[0].x = 0.0;
        local_78[0].y = 0.0;
        local_78[1].x = 0.0;
        local_78[1].y = 0.0;
        local_78[2].x = 0.0;
        local_78[2].y = 0.0;
        lVar7 = 0;
        do {
          uVar1 = (uVar8 & 0xffffffff) + lVar7;
          uVar6 = (uint)uVar1;
          if (puVar9 != (unsigned_short *)0x0) {
            uVar6 = (uint)puVar9[uVar1 & 0xffffffff];
          }
          IVar5 = pIVar4[(ulong)uVar2 + (ulong)uVar6].pos;
          local_78[lVar7] = IVar5;
          auVar10._8_8_ = 0;
          auVar10._0_4_ = IVar5.x;
          auVar10._4_4_ = IVar5.y;
          auVar16 = vminps_avx(auVar10,auVar16);
          auVar15 = vmaxps_avx(auVar10,auVar15);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (show_mesh) {
          ImDrawList::AddPolyline(out_draw_list,local_78,3,0xff00ffff,true,1.0);
        }
        uVar8 = (uVar8 & 0xffffffff) + 3;
      } while ((uint)uVar8 < draw_cmd->ElemCount + draw_cmd->IdxOffset);
      auVar11._0_4_ = (int)auVar16._0_4_;
      auVar11._4_4_ = (int)auVar16._4_4_;
      auVar11._8_4_ = (int)auVar16._8_4_;
      auVar11._12_4_ = (int)auVar16._12_4_;
      local_88 = vcvtdq2ps_avx(auVar11);
      auVar12._0_4_ = (int)auVar15._0_4_;
      auVar12._4_4_ = (int)auVar15._4_4_;
      auVar12._8_4_ = (int)auVar15._8_4_;
      auVar12._12_4_ = (int)auVar15._12_4_;
      local_98 = vcvtdq2ps_avx(auVar12);
    }
    if (show_aabb) {
      auVar13._0_4_ = (int)(float)local_58;
      auVar13._4_4_ = (int)local_58._4_4_;
      auVar13._8_4_ = (int)(float)uStack_50;
      auVar13._12_4_ = (int)uStack_50._4_4_;
      auVar15 = vcvtdq2ps_avx(auVar13);
      local_78[0] = (ImVec2)vmovlps_avx(auVar15);
      auVar14._0_4_ = (int)(float)local_48;
      auVar14._4_4_ = (int)local_48._4_4_;
      auVar14._8_4_ = (int)(float)uStack_40;
      auVar14._12_4_ = (int)uStack_40._4_4_;
      auVar15 = vcvtdq2ps_avx(auVar14);
      local_78[3] = (ImVec2)vmovlps_avx(auVar15);
      ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffff00ff,0.0,0xf,1.0);
      local_78[0] = (ImVec2)vmovlps_avx(local_88);
      local_78[3] = (ImVec2)vmovlps_avx(local_98);
      ImDrawList::AddRect(out_draw_list,local_78,local_78 + 3,0xffffff00,0.0,0xf,1.0);
    }
    out_draw_list->Flags = uVar3;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x2bc9,
                "void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, bool, bool)"
               );
}

Assistant:

void ImGui::DebugNodeDrawCmdShowMeshAndBoundingBox(ImDrawList* out_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, bool show_mesh, bool show_aabb)
{
    IM_ASSERT(show_mesh || show_aabb);
    ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
    ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + draw_cmd->VtxOffset;

    // Draw wire-frame version of all triangles
    ImRect clip_rect = draw_cmd->ClipRect;
    ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    ImDrawListFlags backup_flags = out_draw_list->Flags;
    out_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
    for (unsigned int idx_n = draw_cmd->IdxOffset; idx_n < draw_cmd->IdxOffset + draw_cmd->ElemCount; )
    {
        ImVec2 triangle[3];
        for (int n = 0; n < 3; n++, idx_n++)
            vtxs_rect.Add((triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos));
        if (show_mesh)
            out_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
    }
    // Draw bounding boxes
    if (show_aabb)
    {
        out_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
        out_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
    }
    out_draw_list->Flags = backup_flags;
}